

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<unsigned_int> * __thiscall
kj::_::ExceptionOr<unsigned_int>::operator=
          (ExceptionOr<unsigned_int> *this,ExceptionOr<unsigned_int> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<unsigned_int>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;